

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

float __thiscall nv::BSplineFilter::evaluate(BSplineFilter *this,float x)

{
  float fVar1;
  double dVar2;
  float t;
  float x_local;
  BSplineFilter *this_local;
  
  dVar2 = std::fabs((double)(ulong)(uint)x);
  fVar1 = SUB84(dVar2,0);
  if (1.0 <= fVar1) {
    if (2.0 <= fVar1) {
      this_local._4_4_ = 0.0;
    }
    else {
      fVar1 = 2.0 - fVar1;
      this_local._4_4_ = (fVar1 * fVar1 * fVar1) / 6.0;
    }
  }
  else {
    this_local._4_4_ = (fVar1 * fVar1 * (fVar1 * 3.0 + -6.0) + 4.0) / 6.0;
  }
  return this_local._4_4_;
}

Assistant:

float BSplineFilter::evaluate(float x) const
{
	x = fabs(x);
    if( x < 1.0f ) return (4.0f + x * x * (-6.0f + x * 3.0f)) / 6.0f;
    if( x < 2.0f ) { 
    	float t = 2.0f - x;
    	return t * t * t / 6.0f;
    }
    return 0.0f;
}